

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O1

void __thiscall WriteIncludesBase::acceptUI(WriteIncludesBase *this,DomUI *node)

{
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,_QHashDummyValue>::clear(&(this->m_knownClasses).q_hash);
  this->m_laidOut = false;
  if (node->m_includes != (DomIncludes *)0x0) {
    (*(this->super_TreeWalker)._vptr_TreeWalker[0x18])(this);
  }
  if (node->m_customWidgets != (DomCustomWidgets *)0x0) {
    TreeWalker::acceptCustomWidgets(&this->super_TreeWalker,node->m_customWidgets);
  }
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = L"QApplication";
  local_38.d.size = 0xc;
  add(this,&local_38,(DomCustomWidget *)0x0);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = L"QVariant";
  local_38.d.size = 8;
  add(this,&local_38,(DomCustomWidget *)0x0);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (node->m_buttonGroups != (DomButtonGroups *)0x0) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"QButtonGroup";
    local_38.d.size = 0xc;
    add(this,&local_38,(DomCustomWidget *)0x0);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  TreeWalker::acceptUI(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptUI(DomUI *node)
{
    m_knownClasses.clear();
    m_laidOut = false;

    if (node->elementIncludes())
        acceptIncludes(node->elementIncludes());

    // Populate known custom widgets first
    if (node->elementCustomWidgets())
        TreeWalker::acceptCustomWidgets(node->elementCustomWidgets());

    add(QStringLiteral("QApplication"));
    add(QStringLiteral("QVariant"));

    if (node->elementButtonGroups())
        add(QStringLiteral("QButtonGroup"));

    TreeWalker::acceptUI(node);
}